

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *this)

{
  QString::~QString((QString *)0x299c20);
  QStringBuilder<const_QString_&,_QString>::~QStringBuilder
            ((QStringBuilder<const_QString_&,_QString> *)0x299c2a);
  return;
}

Assistant:

~QStringBuilder() = default;